

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O0

float Cgt_ManComputeCoverage(Aig_Man_t *pAig,Vec_Vec_t *vGates)

{
  int iVar1;
  Ssw_Sml_t *p;
  Vec_Ptr_t *vObjs;
  undefined4 local_38;
  undefined4 local_34;
  int nTransSaved;
  int i;
  Vec_Ptr_t *vOne;
  Ssw_Sml_t *pSml;
  int nWords;
  int nFrames;
  Vec_Vec_t *vGates_local;
  Aig_Man_t *pAig_local;
  
  local_38 = 0;
  p = Ssw_SmlSimulateSeq(pAig,0,0x20,1);
  for (local_34 = 0; iVar1 = Vec_VecSize(vGates), local_34 < iVar1; local_34 = local_34 + 1) {
    vObjs = Vec_VecEntry(vGates,local_34);
    iVar1 = Ssw_SmlNodeCountOnesRealVec(p,vObjs);
    local_38 = iVar1 + local_38;
  }
  Ssw_SmlStop(p);
  iVar1 = Vec_VecSize(vGates);
  return (((((float)local_38 * 100.0) / 32.0) / 32.0) / 1.0) / (float)iVar1;
}

Assistant:

float Cgt_ManComputeCoverage( Aig_Man_t * pAig, Vec_Vec_t * vGates )
{
    int nFrames = 32;
    int nWords  =  1;
    Ssw_Sml_t * pSml;
    Vec_Ptr_t * vOne;
    int i, nTransSaved = 0;
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
    Vec_VecForEachLevel( vGates, vOne, i )
        nTransSaved += Ssw_SmlNodeCountOnesRealVec( pSml, vOne );
    Ssw_SmlStop( pSml );
    return (float)100.0*nTransSaved/32/nFrames/nWords/Vec_VecSize(vGates);
}